

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coded_stream.cc
# Opt level: O1

uint8_t * __thiscall google::protobuf::io::EpsCopyOutputStream::Next(EpsCopyOutputStream *this)

{
  uint8_t *puVar1;
  undefined8 uVar2;
  int iVar3;
  ulong uVar4;
  EpsCopyOutputStream *unaff_RBX;
  uint8_t *__src;
  int size;
  void *data;
  uint local_44;
  uint8_t *local_40 [2];
  
  if (this->had_error_ == true) {
    Next((EpsCopyOutputStream *)local_40);
  }
  else {
    unaff_RBX = this;
    if (this->stream_ != (ZeroCopyOutputStream *)0x0) {
      puVar1 = this->end_;
      __src = this->buffer_;
      if (this->buffer_end_ != (uint8_t *)0x0) {
        memcpy(this->buffer_end_,__src,(long)puVar1 - (long)__src);
        do {
          iVar3 = (*this->stream_->_vptr_ZeroCopyOutputStream[2])(this->stream_,local_40,&local_44);
          if ((char)iVar3 == '\0') {
            this->had_error_ = true;
            this->end_ = this->buffer_ + 0x10;
            return __src;
          }
          uVar4 = (ulong)local_44;
        } while (uVar4 == 0);
        if (0x10 < (int)local_44) {
          uVar2 = *(undefined8 *)(this->end_ + 8);
          *(undefined8 *)local_40[0] = *(undefined8 *)this->end_;
          *(undefined8 *)(local_40[0] + 8) = uVar2;
          this->end_ = local_40[0] + (uVar4 - 0x10);
          this->buffer_end_ = (uint8_t *)0x0;
          return local_40[0];
        }
        if (0 < (int)local_44) {
          uVar2 = *(undefined8 *)(this->end_ + 8);
          *(undefined8 *)__src = *(undefined8 *)this->end_;
          *(undefined8 *)(this->buffer_ + 8) = uVar2;
          this->buffer_end_ = local_40[0];
          this->end_ = __src + uVar4;
          return __src;
        }
        Next((EpsCopyOutputStream *)local_40);
      }
      uVar2 = *(undefined8 *)(puVar1 + 8);
      *(undefined8 *)__src = *(undefined8 *)puVar1;
      *(undefined8 *)(this->buffer_ + 8) = uVar2;
      this->buffer_end_ = puVar1;
      goto LAB_002317f5;
    }
  }
  unaff_RBX->had_error_ = true;
  __src = unaff_RBX->buffer_;
LAB_002317f5:
  unaff_RBX->end_ = unaff_RBX->buffer_ + 0x10;
  return __src;
}

Assistant:

uint8_t* EpsCopyOutputStream::Next() {
  ABSL_DCHECK(!had_error_);  // NOLINT
  if (ABSL_PREDICT_FALSE(stream_ == nullptr)) return Error();
  if (buffer_end_) {
    // We're in the patch buffer and need to fill up the previous buffer.
    std::memcpy(buffer_end_, buffer_, end_ - buffer_);
    uint8_t* ptr;
    int size;
    do {
      void* data;
      if (ABSL_PREDICT_FALSE(!stream_->Next(&data, &size))) {
        // Stream has an error, we use the patch buffer to continue to be
        // able to write.
        return Error();
      }
      ptr = static_cast<uint8_t*>(data);
    } while (size == 0);
    if (ABSL_PREDICT_TRUE(size > kSlopBytes)) {
      std::memcpy(ptr, end_, kSlopBytes);
      end_ = ptr + size - kSlopBytes;
      buffer_end_ = nullptr;
      return ptr;
    } else {
      ABSL_DCHECK(size > 0);  // NOLINT
      // Buffer to small
      std::memmove(buffer_, end_, kSlopBytes);
      buffer_end_ = ptr;
      end_ = buffer_ + size;
      return buffer_;
    }
  } else {
    std::memcpy(buffer_, end_, kSlopBytes);
    buffer_end_ = end_;
    end_ = buffer_ + kSlopBytes;
    return buffer_;
  }
}